

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_map_to_edge(REF_INT map)

{
  uint uVar1;
  ulong in_RAX;
  uint uVar2;
  
  uVar1 = 0x800;
  for (uVar2 = 0xb; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    if ((int)uVar1 <= map) {
      printf("edge %d bit %d\n",(ulong)uVar2,(ulong)uVar1);
      map = map - uVar1;
    }
    in_RAX = (long)(int)uVar1 / 2 & 0xffffffff;
    uVar1 = (uint)((long)(int)uVar1 / 2);
  }
  return (REF_STATUS)in_RAX;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_map_to_edge(REF_INT map) {
  REF_INT edge, bit;

  bit = 2048;
  for (edge = 11; edge >= 0; edge--) {
    if (map >= bit) {
      map -= bit;
      printf("edge %d bit %d\n", edge, bit);
    }
    bit /= 2;
  }

  return REF_SUCCESS;
}